

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

bool __thiscall
glslang::TParseContext::constructorTextureSamplerError
          (TParseContext *this,TSourceLoc *loc,TFunction *function)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TSampler *right;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  char *pcVar7;
  long lVar8;
  _func_int **pp_Var9;
  bool bVar10;
  TString constructorName;
  TSampler local_5c;
  TString local_58;
  
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  TType::getBasicTypeString_abi_cxx11_(&local_58,(TType *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  pp_Var9 = (function->super_TSymbol)._vptr_TSymbol;
  if (iVar3 == 1) {
    iVar3 = (*pp_Var9[0x28])(function,0);
    plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar3) + 8);
    uVar4 = (**(code **)(*plVar1 + 0x38))(plVar1);
    bVar10 = true;
    if ((uVar4 & 0xfffffffe) == 8) {
      iVar3 = (**(code **)(*plVar1 + 0x60))(plVar1);
      bVar10 = iVar3 != 2;
    }
    iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_ARB_bindless_texture");
    if ((char)iVar3 != '\x01' || bVar10) {
      if ((char)iVar3 == '\0') {
        pcVar7 = "sampler-constructor requires the extension GL_ARB_bindless_texture enabled";
      }
      else {
        pcVar7 = "sampler-constructor requires the input to be ivec2 or uvec2";
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar7,local_58._M_dataplus._M_p,"");
      return true;
    }
    puVar5 = (uint *)(**(code **)(*plVar1 + 0x48))(plVar1);
    if ((((*puVar5 >> 0x13 & 1) == 0) || (uVar4 = *puVar5 & 0xff00, uVar4 == 0x700)) ||
       (uVar4 == 0x800)) {
      lVar8 = 0x528;
    }
    else {
      lVar8 = 0x558;
    }
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                           *)((long)&((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate)->language + lVar8),&this->currentCaller);
    *pmVar6 = AstRefTypeFunc;
    return false;
  }
  iVar3 = (*pp_Var9[0x24])(function);
  if (iVar3 == 2) {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xe8))
                      ((long *)CONCAT44(extraout_var_01,iVar3));
    if (cVar2 == '\0') {
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
      iVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar3) + 8) + 0x38))();
      if (iVar3 == 0xe) {
        iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
        lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_03,iVar3) + 8) + 0x48))();
        if ((*(byte *)(lVar8 + 2) & 0x28) == 0) {
          iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
          cVar2 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar3) + 8) + 0xe8))();
          if (cVar2 == '\0') {
            iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
            puVar5 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x40))
                                       ((long *)CONCAT44(extraout_var_05,iVar3));
            local_5c = (TSampler)(*puVar5 & 0xffedffff);
            iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
            right = (TSampler *)
                    (**(code **)(**(long **)(CONCAT44(extraout_var_06,iVar3) + 8) + 0x48))();
            bVar10 = TSampler::operator==(&local_5c,right);
            if (bVar10) {
              iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,1);
              iVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar3) + 8) + 0x38))();
              pcVar7 = 
              "sampler-constructor second argument must be a scalar sampler or samplerShadow";
              if (iVar3 == 0xe) {
                iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,1);
                lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar3) + 8) + 0x48))();
                if ((*(byte *)(lVar8 + 2) & 0x20) != 0) {
                  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,1);
                  cVar2 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar3) + 8) + 0xe8))();
                  if (cVar2 == '\0') {
                    return false;
                  }
                }
              }
            }
            else {
              pcVar7 = 
              "sampler-constructor first argument must be a *texture* type matching the dimensionality and sampled type of the constructor"
              ;
            }
            pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            goto LAB_004ac91e;
          }
        }
      }
      pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar7 = "sampler-constructor first argument must be a scalar *texture* type";
    }
    else {
      pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar7 = "sampler-constructor cannot make an array of samplers";
    }
  }
  else {
    pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar7 = "sampler-constructor requires two arguments";
  }
LAB_004ac91e:
  (*pp_Var9[0x2d])(this,loc,pcVar7,local_58._M_dataplus._M_p,"");
  return true;
}

Assistant:

bool TParseContext::constructorTextureSamplerError(const TSourceLoc& loc, const TFunction& function)
{
    TString constructorName = function.getType().getBasicTypeString();  // TODO: performance: should not be making copy; interface needs to change
    const char* token = constructorName.c_str();
    // verify the constructor for bindless texture, the input must be ivec2 or uvec2
    if (function.getParamCount() == 1) {
        TType* pType = function[0].type;
        TBasicType basicType = pType->getBasicType();
        bool isIntegerVec2 = ((basicType == EbtUint || basicType == EbtInt) && pType->getVectorSize() == 2);
        bool bindlessMode = extensionTurnedOn(E_GL_ARB_bindless_texture);
        if (isIntegerVec2 && bindlessMode) {
            if (pType->getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeFunc);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeFunc);
            return false;
        } else {
            if (!bindlessMode)
                error(loc, "sampler-constructor requires the extension GL_ARB_bindless_texture enabled", token, "");
            else
                error(loc, "sampler-constructor requires the input to be ivec2 or uvec2", token, "");
            return true;
        }
    }

    // exactly two arguments needed
    if (function.getParamCount() != 2) {
        error(loc, "sampler-constructor requires two arguments", token, "");
        return true;
    }

    // For now, not allowing arrayed constructors, the rest of this function
    // is set up to allow them, if this test is removed:
    if (function.getType().isArray()) {
        error(loc, "sampler-constructor cannot make an array of samplers", token, "");
        return true;
    }

    // first argument
    //  * the constructor's first argument must be a texture type
    //  * the dimensionality (1D, 2D, 3D, Cube, Rect, Buffer, MS, and Array)
    //    of the texture type must match that of the constructed sampler type
    //    (that is, the suffixes of the type of the first argument and the
    //    type of the constructor will be spelled the same way)
    if (function[0].type->getBasicType() != EbtSampler ||
        ! function[0].type->getSampler().isTexture() ||
        function[0].type->isArray()) {
        error(loc, "sampler-constructor first argument must be a scalar *texture* type", token, "");
        return true;
    }
    // simulate the first argument's impact on the result type, so it can be compared with the encapsulated operator!=()
    TSampler texture = function.getType().getSampler();
    texture.setCombined(false);
    texture.shadow = false;
    if (texture != function[0].type->getSampler()) {
        error(loc, "sampler-constructor first argument must be a *texture* type"
                   " matching the dimensionality and sampled type of the constructor", token, "");
        return true;
    }

    // second argument
    //   * the constructor's second argument must be a scalar of type
    //     *sampler* or *samplerShadow*
    if (  function[1].type->getBasicType() != EbtSampler ||
        ! function[1].type->getSampler().isPureSampler() ||
          function[1].type->isArray()) {
        error(loc, "sampler-constructor second argument must be a scalar sampler or samplerShadow", token, "");
        return true;
    }

    return false;
}